

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::computeDualActivity
          (SPxLPBase<double> *this,VectorBase<double> *dual,VectorBase<double> *activity,
          bool unscaled)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  double *pdVar5;
  byte in_CL;
  string *in_RDX;
  long in_RDI;
  DSVectorBase<double> tmp;
  int r;
  string *in_stack_fffffffffffffee8;
  SPxLPBase<double> *in_stack_fffffffffffffef0;
  double *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  SVectorBase<double> *in_stack_ffffffffffffff10;
  undefined1 local_a0 [32];
  int local_80;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  allocator local_41;
  string local_40 [39];
  byte local_19;
  string *local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  iVar2 = VectorBase<double>::dim((VectorBase<double> *)0x2411e4);
  iVar3 = nRows((SPxLPBase<double> *)0x2411f2);
  if (iVar2 != iVar3) {
    local_55 = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,"XSPXLP02 Dual vector for computing dual activity has wrong dimension",
               &local_41);
    SPxInternalCodeException::SPxInternalCodeException
              ((SPxInternalCodeException *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    local_55 = 0;
    __cxa_throw(uVar4,&SPxInternalCodeException::typeinfo,
                SPxInternalCodeException::~SPxInternalCodeException);
  }
  iVar2 = VectorBase<double>::dim((VectorBase<double> *)0x2412e9);
  iVar3 = nCols((SPxLPBase<double> *)0x2412f7);
  if (iVar2 == iVar3) {
    local_80 = 0;
    while( true ) {
      iVar2 = local_80;
      iVar3 = nRows((SPxLPBase<double> *)0x241401);
      bVar1 = false;
      if (iVar2 < iVar3) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffef0,
                            (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        bVar1 = *pdVar5 == 0.0;
      }
      iVar2 = local_80;
      if (!bVar1) break;
      local_80 = local_80 + 1;
    }
    iVar3 = nRows((SPxLPBase<double> *)0x241470);
    if (iVar2 < iVar3) {
      nCols((SPxLPBase<double> *)0x241496);
      DSVectorBase<double>::DSVectorBase
                ((DSVectorBase<double> *)in_stack_ffffffffffffff00,
                 (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      if (((local_19 & 1) == 0) || ((*(byte *)(in_RDI + 0x1a0) & 1) == 0)) {
        in_stack_ffffffffffffff10 =
             rowVector(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        VectorBase<double>::operator=
                  ((VectorBase<double> *)in_stack_ffffffffffffff10,
                   (SVectorBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      }
      else {
        (**(code **)(**(long **)(in_RDI + 0x1a8) + 0xd0))
                  (*(long **)(in_RDI + 0x1a8),in_RDI,local_80,local_a0);
        VectorBase<double>::operator=
                  ((VectorBase<double> *)in_stack_ffffffffffffff10,
                   (SVectorBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      }
      VectorBase<double>::operator[]
                ((VectorBase<double> *)in_stack_fffffffffffffef0,
                 (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      VectorBase<double>::operator*=
                ((VectorBase<double> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      while( true ) {
        local_80 = local_80 + 1;
        iVar2 = local_80;
        iVar3 = nRows((SPxLPBase<double> *)0x24158f);
        if (iVar3 <= iVar2) break;
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffef0,
                            (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        if ((*pdVar5 != 0.0) || (NAN(*pdVar5))) {
          if (((local_19 & 1) == 0) || ((*(byte *)(in_RDI + 0x1a0) & 1) == 0)) {
            in_stack_fffffffffffffee8 = local_18;
            in_stack_fffffffffffffef0 =
                 (SPxLPBase<double> *)
                 VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffef0,
                            (int)((ulong)local_18 >> 0x20));
            rowVector(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
            VectorBase<double>::multAdd<double,double>
                      ((VectorBase<double> *)in_stack_ffffffffffffff10,
                       (double *)CONCAT44(iVar3,iVar2),
                       (SVectorBase<double> *)in_stack_ffffffffffffff00);
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x1a8) + 0xd0))
                      (*(long **)(in_RDI + 0x1a8),in_RDI,local_80,local_a0);
            in_stack_ffffffffffffff00 = local_18;
            VectorBase<double>::operator[]
                      ((VectorBase<double> *)in_stack_fffffffffffffef0,
                       (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
            VectorBase<double>::multAdd<double,double>
                      ((VectorBase<double> *)in_stack_ffffffffffffff10,
                       (double *)CONCAT44(iVar3,iVar2),
                       (SVectorBase<double> *)in_stack_ffffffffffffff00);
          }
        }
      }
      DSVectorBase<double>::~DSVectorBase((DSVectorBase<double> *)in_stack_fffffffffffffef0);
    }
    else {
      VectorBase<double>::clear((VectorBase<double> *)in_stack_ffffffffffffff00);
    }
    return;
  }
  local_7a = 1;
  uVar4 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,"XSPXLP04 Activity vector computing dual activity has wrong dimension",
             &local_79);
  SPxInternalCodeException::SPxInternalCodeException
            ((SPxInternalCodeException *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_7a = 0;
  __cxa_throw(uVar4,&SPxInternalCodeException::typeinfo,
              SPxInternalCodeException::~SPxInternalCodeException);
}

Assistant:

inline
void SPxLPBase<R>::computeDualActivity(const VectorBase<R>& dual, VectorBase<R>& activity,
                                       const bool unscaled) const
{
   if(dual.dim() != nRows())
      throw SPxInternalCodeException("XSPXLP02 Dual vector for computing dual activity has wrong dimension");

   if(activity.dim() != nCols())
      throw SPxInternalCodeException("XSPXLP04 Activity vector computing dual activity has wrong dimension");

   int r;

   for(r = 0; r < nRows() && dual[r] == 0; r++)
      ;

   if(r >= nRows())
   {
      activity.clear();
      return;
   }

   DSVectorBase<R> tmp(nCols());

   if(unscaled && _isScaled)
   {
      lp_scaler->getRowUnscaled(*this, r, tmp);
      activity = tmp;
   }
   else
      activity = rowVector(r);

   activity *= dual[r];
   r++;

   for(; r < nRows(); r++)
   {
      if(dual[r] != 0)
      {
         if(unscaled && _isScaled)
         {
            lp_scaler->getRowUnscaled(*this, r, tmp);
            activity.multAdd(dual[r], tmp);
         }
         else
            activity.multAdd(dual[r], rowVector(r));
      }
   }
}